

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_writer.cc
# Opt level: O0

ssize_t __thiscall FileWriter::write(FileWriter *this,int __fd,void *__buf,size_t __n)

{
  undefined1 uVar1;
  ostream *poVar2;
  ssize_t sVar3;
  undefined4 in_register_00000034;
  ofstream of;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  *in_stack_00000068;
  ostream *in_stack_00000070;
  string path;
  undefined7 in_stack_fffffffffffffda8;
  FileWriter *in_stack_fffffffffffffdb0;
  string *in_stack_fffffffffffffdd0;
  FileWriter *in_stack_fffffffffffffdd8;
  string *in_stack_fffffffffffffe60;
  FileWriter *in_stack_fffffffffffffe68;
  string local_40 [32];
  size_t local_20;
  void *local_18;
  undefined8 local_10;
  FileWriter *local_8;
  
  local_10 = CONCAT44(in_register_00000034,__fd);
  local_20 = __n;
  local_18 = __buf;
  local_8 = this;
  buildPath(in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd0);
  uVar1 = tryWrite(in_stack_fffffffffffffe68,in_stack_fffffffffffffe60);
  if ((bool)uVar1) {
    poVar2 = std::operator<<((ostream *)&std::cout,"Writing: ");
    std::operator<<(poVar2,local_40);
    std::ofstream::ofstream(&stack0xfffffffffffffdb0,local_40,_S_out);
    nlohmann::operator<<(in_stack_00000070,in_stack_00000068);
    logTime(in_stack_fffffffffffffdb0,(Timer *)CONCAT17(uVar1,in_stack_fffffffffffffda8));
    std::ofstream::~ofstream(&stack0xfffffffffffffdb0);
  }
  else {
    poVar2 = std::operator<<((ostream *)&std::cout,"Skipping (file exists): ");
    std::operator<<(poVar2,local_40);
    logTime(in_stack_fffffffffffffdb0,(Timer *)CONCAT17(uVar1,in_stack_fffffffffffffda8));
  }
  sVar3 = std::__cxx11::string::~string(local_40);
  return sVar3;
}

Assistant:

void FileWriter::write(
  const std::string& tail,
  const nlohmann::json& json,
  const Timer* t) {
  auto path = buildPath(tail);
  if (!tryWrite(path)) {
    std::cout << "Skipping (file exists): " << path;
    logTime(t);
    return;
  }

  std::cout << "Writing: " << path;
  std::ofstream of(path);
  of << json;
  logTime(t);
}